

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void libcellml::Variable::removeEquivalenceMappingId(VariablePtr *variable1,VariablePtr *variable2)

{
  __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *equivalentVariable;
  VariablePtr *equivalentVariable_00;
  bool bVar1;
  element_type *peVar2;
  VariableImpl *pVVar3;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  VariablePtr *variable2_local;
  VariablePtr *variable1_local;
  
  local_18 = (__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             variable2;
  variable2_local = variable1;
  bVar1 = std::operator!=(variable1,(nullptr_t)0x0);
  if ((bVar1) &&
     (bVar1 = std::operator!=((shared_ptr<libcellml::Variable> *)local_18,(nullptr_t)0x0), bVar1)) {
    peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable2_local);
    bVar1 = hasEquivalentVariable(peVar2,(VariablePtr *)local_18,true);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable2_local);
      pVVar3 = pFunc(peVar2);
      equivalentVariable = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
      VariableImpl::setEquivalentMappingId(pVVar3,(VariablePtr *)equivalentVariable,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      peVar2 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_18);
      pVVar3 = pFunc(peVar2);
      equivalentVariable_00 = variable2_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
      VariableImpl::setEquivalentMappingId(pVVar3,equivalentVariable_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  return;
}

Assistant:

void Variable::removeEquivalenceMappingId(const VariablePtr &variable1, const VariablePtr &variable2)
{
    if ((variable1 != nullptr) && (variable2 != nullptr)) {
        if (variable1->hasEquivalentVariable(variable2, true)) {
            variable1->pFunc()->setEquivalentMappingId(variable2, "");
            variable2->pFunc()->setEquivalentMappingId(variable1, "");
        }
    }
}